

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraKateGenerator::CreateKateProjectFile(cmExtraKateGenerator *this,cmLocalGenerator *lg)

{
  byte bVar1;
  char *pcVar2;
  ostream *poVar3;
  bool bVar4;
  string local_2c0;
  uint local_29c;
  undefined1 local_298 [8];
  cmGeneratedFileStream fout;
  allocator local_39;
  string local_38 [8];
  string filename;
  cmLocalGenerator *lg_local;
  cmExtraKateGenerator *this_local;
  
  filename.field_2._8_8_ = lg;
  pcVar2 = cmLocalGenerator::GetBinaryDirectory(lg);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar2,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::string::operator+=(local_38,"/.kateproject");
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_298,pcVar2,false,None)
  ;
  bVar1 = std::ios::operator!((ios *)(local_298 + (long)*(_func_int **)((long)local_298 + -0x18)));
  bVar4 = (bVar1 & 1) != 0;
  if (!bVar4) {
    poVar3 = std::operator<<((ostream *)local_298,"{\n\t\"name\": \"");
    poVar3 = std::operator<<(poVar3,(string *)&this->ProjectName);
    poVar3 = std::operator<<(poVar3,"\",\n\t\"directory\": \"");
    pcVar2 = cmLocalGenerator::GetSourceDirectory((cmLocalGenerator *)filename.field_2._8_8_);
    poVar3 = std::operator<<(poVar3,pcVar2);
    poVar3 = std::operator<<(poVar3,"\",\n\t\"files\": [ { ");
    GenerateFilesString_abi_cxx11_(&local_2c0,this,(cmLocalGenerator *)filename.field_2._8_8_);
    poVar3 = std::operator<<(poVar3,(string *)&local_2c0);
    std::operator<<(poVar3,"} ],\n");
    std::__cxx11::string::~string((string *)&local_2c0);
    WriteTargets(this,(cmLocalGenerator *)filename.field_2._8_8_,(cmGeneratedFileStream *)local_298)
    ;
    std::operator<<((ostream *)local_298,"}\n");
  }
  local_29c = (uint)bVar4;
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void cmExtraKateGenerator::CreateKateProjectFile(
  const cmLocalGenerator* lg) const
{
  std::string filename = lg->GetBinaryDirectory();
  filename += "/.kateproject";
  cmGeneratedFileStream fout(filename.c_str());
  if (!fout) {
    return;
  }

  /* clang-format off */
  fout <<
    "{\n"
    "\t\"name\": \"" << this->ProjectName << "\",\n"
    "\t\"directory\": \"" << lg->GetSourceDirectory() << "\",\n"
    "\t\"files\": [ { " << this->GenerateFilesString(lg) << "} ],\n";
  /* clang-format on */
  this->WriteTargets(lg, fout);
  fout << "}\n";
}